

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_path.cpp
# Opt level: O3

DWORD SearchPathA(LPCSTR lpPath,LPCSTR lpFileName,LPCSTR lpExtension,DWORD nBufferLength,
                 LPSTR lpBuffer,LPSTR *lpFilePart)

{
  SIZE_T *lpFileName_00;
  ulong count;
  long lVar1;
  byte bVar2;
  DWORD nBufferLength_00;
  int iVar3;
  errno_t eVar4;
  size_t sVar5;
  char *pcVar6;
  size_t sVar7;
  DWORD dwErrCode;
  char *pcVar8;
  long in_FS_OFFSET;
  DWORD local_c4;
  undefined1 local_b8 [8];
  PathCharString CanonicalFullPathPS;
  PathCharString FullPathPS;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lpFileName_00 = &CanonicalFullPathPS.m_count;
  FullPathPS.m_size = 0;
  CanonicalFullPathPS._32_8_ = local_b8;
  CanonicalFullPathPS.m_size = 0;
  if (!PAL_InitializeChakraCoreCalled) goto LAB_0032eaae;
  if (lpPath == (LPCSTR)0x0) {
    fprintf(_stderr,"] %s %s:%d","SearchPathA",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_path.cpp"
            ,0x466);
    pcVar6 = "lpPath may not be NULL\n";
LAB_0032e6de:
    dwErrCode = 0x57;
    fprintf(_stderr,pcVar6);
LAB_0032e6f5:
    SetLastError(dwErrCode);
LAB_0032e6fd:
    nBufferLength_00 = 0;
  }
  else {
    if (lpFileName == (LPCSTR)0x0) {
      fprintf(_stderr,"] %s %s:%d","SearchPathA",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_path.cpp"
              ,0x46c);
      pcVar6 = "lpFileName may not be NULL\n";
      goto LAB_0032e6de;
    }
    if (lpExtension != (LPCSTR)0x0) {
      fprintf(_stderr,"] %s %s:%d","SearchPathA",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_path.cpp"
              ,0x472);
      dwErrCode = 0x57;
      fprintf(_stderr,"lpExtension must be NULL, is %p instead\n",lpExtension);
      goto LAB_0032e6f5;
    }
    sVar5 = strlen(lpFileName);
    if ((*lpFileName != '/') && (*lpFileName != '\\')) {
      if (*lpPath != '\0') {
        bVar2 = PAL_InitializeChakraCoreCalled;
        do {
          while( true ) {
            pcVar6 = strchr(lpPath,0x3a);
            if (pcVar6 == (char *)0x0) {
              sVar7 = strlen(lpPath);
              pcVar6 = lpPath + sVar7;
              pcVar8 = pcVar6;
            }
            else {
              pcVar8 = pcVar6 + 1;
            }
            sVar7 = (long)pcVar6 - (long)lpPath;
            count = sVar5 + 1 + sVar7;
            if (count < 0x400) break;
            if ((bVar2 & 1) == 0) goto LAB_0032eaae;
LAB_0032e902:
            lpPath = pcVar8;
            if (*pcVar8 == '\0') goto LAB_0032ea69;
          }
          if (pcVar6 == lpPath) goto LAB_0032e902;
          StackString<32UL,_char>::Resize
                    ((StackString<32UL,_char> *)&CanonicalFullPathPS.m_count,count);
          local_c4 = 8;
          if (lpFileName_00 == (SIZE_T *)0x0) {
LAB_0032eaf8:
            SetLastError(local_c4);
            goto LAB_0032e6fd;
          }
          memcpy(lpFileName_00,lpPath,sVar7);
          *(undefined1 *)((long)lpFileName_00 + sVar7) = 0x2f;
          eVar4 = strcpy_s((char *)((long)&CanonicalFullPathPS + sVar7 + 0x39),sVar5 + 1,lpFileName)
          ;
          if (eVar4 != 0) {
            local_c4 = 0xce;
            if (PAL_InitializeChakraCoreCalled != false) goto LAB_0032eaf8;
            goto LAB_0032eaae;
          }
          if (count < FullPathPS.m_size) {
            FullPathPS.m_size = count;
          }
          *(undefined1 *)((long)lpFileName_00 + FullPathPS.m_size) = 0;
          StackString<32UL,_char>::Resize((StackString<32UL,_char> *)local_b8,0x400);
          pcVar6 = (char *)CanonicalFullPathPS._32_8_;
          if (CanonicalFullPathPS._32_8_ == 0) goto LAB_0032eaf8;
          nBufferLength_00 =
               GetFullPathNameA((LPCSTR)lpFileName_00,0x401,(LPSTR)CanonicalFullPathPS._32_8_,
                                (LPSTR *)0x0);
          if (nBufferLength_00 < CanonicalFullPathPS.m_size) {
            CanonicalFullPathPS.m_size = (ulong)nBufferLength_00;
          }
          *(undefined1 *)(CanonicalFullPathPS._32_8_ + CanonicalFullPathPS.m_size) = 0;
          if (0x401 < nBufferLength_00) {
            StackString<32UL,_char>::Resize
                      ((StackString<32UL,_char> *)local_b8,(ulong)(nBufferLength_00 - 1));
            pcVar6 = (char *)CanonicalFullPathPS._32_8_;
            nBufferLength_00 =
                 GetFullPathNameA((LPCSTR)lpFileName_00,nBufferLength_00,
                                  (LPSTR)CanonicalFullPathPS._32_8_,(LPSTR *)0x0);
            if (nBufferLength_00 < CanonicalFullPathPS.m_size) {
              CanonicalFullPathPS.m_size = (ulong)nBufferLength_00;
            }
            *(undefined1 *)(CanonicalFullPathPS._32_8_ + CanonicalFullPathPS.m_size) = 0;
          }
          if (nBufferLength_00 == 0) {
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_0032eaae;
            GetLastError();
          }
          else {
            iVar3 = access(pcVar6,0);
            if (iVar3 == 0) goto LAB_0032e85b;
          }
          lpPath = pcVar8;
          bVar2 = PAL_InitializeChakraCoreCalled;
        } while (*pcVar8 != '\0');
      }
LAB_0032ea69:
      dwErrCode = 2;
      goto LAB_0032e6f5;
    }
    if (0x3ff < sVar5) {
      dwErrCode = 0x57;
      goto LAB_0032e6f5;
    }
    StackString<32UL,_char>::Resize((StackString<32UL,_char> *)local_b8,0x400);
    pcVar6 = (char *)CanonicalFullPathPS._32_8_;
    if (CanonicalFullPathPS._32_8_ == 0) {
      dwErrCode = 8;
      goto LAB_0032e6f5;
    }
    nBufferLength_00 =
         GetFullPathNameA(lpFileName,0x401,(LPSTR)CanonicalFullPathPS._32_8_,(LPSTR *)0x0);
    if (nBufferLength_00 < CanonicalFullPathPS.m_size) {
      CanonicalFullPathPS.m_size = (ulong)nBufferLength_00;
    }
    *(undefined1 *)(CanonicalFullPathPS._32_8_ + CanonicalFullPathPS.m_size) = 0;
    if (0x401 < nBufferLength_00) {
      StackString<32UL,_char>::Resize
                ((StackString<32UL,_char> *)local_b8,(ulong)(nBufferLength_00 - 1));
      pcVar6 = (char *)CanonicalFullPathPS._32_8_;
      dwErrCode = 8;
      if (CanonicalFullPathPS._32_8_ == 0) goto LAB_0032e6f5;
      nBufferLength_00 =
           GetFullPathNameA(lpFileName,nBufferLength_00,(LPSTR)CanonicalFullPathPS._32_8_,
                            (LPSTR *)0x0);
      if (nBufferLength_00 < CanonicalFullPathPS.m_size) {
        CanonicalFullPathPS.m_size = (ulong)nBufferLength_00;
      }
      *(undefined1 *)(CanonicalFullPathPS._32_8_ + CanonicalFullPathPS.m_size) = 0;
    }
    if (nBufferLength_00 == 0) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0032eaae;
      GetLastError();
      dwErrCode = 0x57;
      goto LAB_0032e6f5;
    }
    iVar3 = access(pcVar6,0);
    dwErrCode = 2;
    if (iVar3 != 0) goto LAB_0032e6f5;
LAB_0032e85b:
    if (nBufferLength_00 < nBufferLength) {
      if (lpBuffer == (LPSTR)0x0) {
        dwErrCode = 0x57;
      }
      else {
        eVar4 = strcpy_s(lpBuffer,(ulong)nBufferLength,pcVar6);
        if (eVar4 == 0) {
          if (lpFilePart != (LPSTR *)0x0) {
            pcVar6 = strrchr(lpBuffer,0x2f);
            *lpFilePart = pcVar6;
            if (pcVar6 == (char *)0x0) {
              fprintf(_stderr,"] %s %s:%d","SearchPathA",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_path.cpp"
                      ,0x52d);
              fprintf(_stderr,"no \'/\' in full path!\n");
            }
            else {
              *lpFilePart = pcVar6 + 1;
            }
          }
          goto LAB_0032e6ff;
        }
        dwErrCode = 0xce;
      }
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0032eaae;
      goto LAB_0032e6f5;
    }
    nBufferLength_00 = nBufferLength_00 + 1;
  }
LAB_0032e6ff:
  if (PAL_InitializeChakraCoreCalled != false) {
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)local_b8);
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)&CanonicalFullPathPS.m_count);
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
      __stack_chk_fail();
    }
    return nBufferLength_00;
  }
LAB_0032eaae:
  abort();
}

Assistant:

DWORD
PALAPI
SearchPathA(
    IN LPCSTR lpPath,
    IN LPCSTR lpFileName,
    IN LPCSTR lpExtension,
    IN DWORD nBufferLength,
    OUT LPSTR lpBuffer,
    OUT LPSTR *lpFilePart
    )
{
    DWORD nRet = 0;
    CHAR * FullPath;
    size_t FullPathLength = 0;
    PathCharString FullPathPS;
    PathCharString CanonicalFullPathPS;
    CHAR * CanonicalFullPath;
    LPCSTR pPathStart;
    LPCSTR pPathEnd;
    size_t PathLength;
    size_t FileNameLength;
    DWORD length;
    DWORD dw;

    PERF_ENTRY(SearchPathA);
    ENTRY("SearchPathA(lpPath=%p (%s), lpFileName=%p (%s), lpExtension=%p, "
          "nBufferLength=%u, lpBuffer=%p, lpFilePart=%p)\n",
      lpPath,
      lpPath, lpFileName, lpFileName, lpExtension, nBufferLength, lpBuffer,
          lpFilePart);

    /* validate parameters */

    if(NULL == lpPath)
    {
        ASSERT("lpPath may not be NULL\n");
        SetLastError(ERROR_INVALID_PARAMETER);
        goto done;
    }
    if(NULL == lpFileName)
    {
        ASSERT("lpFileName may not be NULL\n");
        SetLastError(ERROR_INVALID_PARAMETER);
        goto done;
    }
    if(NULL != lpExtension)
    {
        ASSERT("lpExtension must be NULL, is %p instead\n", lpExtension);
        SetLastError(ERROR_INVALID_PARAMETER);
        goto done;
    }

    FileNameLength = strlen(lpFileName);

    /* special case : if file name contains absolute path, don't search the
       provided path */
    if('\\' == lpFileName[0] || '/' == lpFileName[0])
    {
        if(FileNameLength >= MAX_LONGPATH)
        {
            WARN("absolute file name <%s> is too long\n", lpFileName);
            SetLastError(ERROR_INVALID_PARAMETER);
            goto done;
        }
        /* Canonicalize the path to deal with back-to-back '/', etc. */
        length = MAX_LONGPATH;
        CanonicalFullPath = CanonicalFullPathPS.OpenStringBuffer(length);
        if (NULL == CanonicalFullPath)
        {
            SetLastError(ERROR_NOT_ENOUGH_MEMORY);
            goto done;
        }
        dw = GetFullPathNameA(lpFileName, length+1, CanonicalFullPath, NULL);
        CanonicalFullPathPS.CloseBuffer(dw);

        if (length+1 < dw)
        {
            CanonicalFullPath = CanonicalFullPathPS.OpenStringBuffer(dw-1);
            if (NULL == CanonicalFullPath)
            {
                SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                goto done;
            }
            dw = GetFullPathNameA(lpFileName, dw,
                                  CanonicalFullPath, NULL);
            CanonicalFullPathPS.CloseBuffer(dw);
        }

        if (dw == 0)
        {
            WARN("couldn't canonicalize path <%s>, error is %#x. failing.\n",
                 lpFileName, GetLastError());
            SetLastError(ERROR_INVALID_PARAMETER);
            goto done;
        }

        /* see if the file exists */
        if(0 == access(CanonicalFullPath, F_OK))
        {
            /* found it */
            nRet = dw;
        }
    }
    else
    {
        LPCSTR pNextPath;

        pNextPath = lpPath;

        while (*pNextPath)
        {
            pPathStart = pNextPath;

            /* get a pointer to the end of the first path in pPathStart */
            pPathEnd = strchr(pPathStart, ':');
            if (!pPathEnd)
            {
                pPathEnd = pPathStart + strlen(pPathStart);
                /* we want to break out of the loop after this pass, so let
                   *pNextPath be '\0' */
                pNextPath = pPathEnd;
            }
            else
            {
                /* point to the next component in the path string */
                pNextPath = pPathEnd+1;
            }

            PathLength = pPathEnd-pPathStart;

            if (PathLength+FileNameLength+1 >= MAX_LONGPATH)
            {
                /* The path+'/'+file length is too long.  Skip it. */
                WARN("path component %.*s is too long, skipping it\n",
                     (int)PathLength, pPathStart);
                continue;
            }
            else if(0 == PathLength)
            {
                /* empty component : there were 2 consecutive ':' */
                continue;
            }

            /* Construct a pathname by concatenating one path from lpPath, '/'
               and lpFileName */
            FullPathLength = PathLength + FileNameLength;
            FullPath = FullPathPS.OpenStringBuffer(FullPathLength+1);
            if (NULL == FullPath)
            {
                SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                goto done;
            }
            memcpy(FullPath, pPathStart, PathLength);
            FullPath[PathLength] = '/';
            if (strcpy_s(&FullPath[PathLength+1], FullPathLength+1-PathLength, lpFileName) != SAFECRT_SUCCESS)
            {
                ERROR("strcpy_s failed!\n");
                SetLastError( ERROR_FILENAME_EXCED_RANGE );
                nRet = 0;
                goto done;
            }

            FullPathPS.CloseBuffer(FullPathLength+1);
            /* Canonicalize the path to deal with back-to-back '/', etc. */
            length = MAX_LONGPATH;
            CanonicalFullPath = CanonicalFullPathPS.OpenStringBuffer(length);
            if (NULL == CanonicalFullPath)
            {
                SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                goto done;
            }
            dw = GetFullPathNameA(FullPath, length+1,
                                  CanonicalFullPath, NULL);
            CanonicalFullPathPS.CloseBuffer(dw);

            if (length+1 < dw)
            {
                CanonicalFullPath = CanonicalFullPathPS.OpenStringBuffer(dw-1);
                dw = GetFullPathNameA(FullPath, dw,
                                      CanonicalFullPath, NULL);
                CanonicalFullPathPS.CloseBuffer(dw);
            }

            if (dw == 0)
            {
                /* Call failed - possibly low memory.  Skip the path */
                WARN("couldn't canonicalize path <%s>, error is %#x. "
                     "skipping it\n", FullPath, GetLastError());
                continue;
            }

            /* see if the file exists */
            if(0 == access(CanonicalFullPath, F_OK))
            {
                /* found it */
                nRet = dw;
                break;
            }
        }
    }

    if (nRet == 0)
    {
       /* file not found anywhere; say so. in Windows, this always seems to say
          FILE_NOT_FOUND, even if path doesn't exist */
       SetLastError(ERROR_FILE_NOT_FOUND);
    }
    else
    {
        if (nRet < nBufferLength)
        {
            if(NULL == lpBuffer)
            {
                /* Windows merily crashes here, but let's not */
                ERROR("caller told us buffer size was %d, but buffer is NULL\n",
                      nBufferLength);
                SetLastError(ERROR_INVALID_PARAMETER);
                nRet = 0;
                goto done;
            }

            if (strcpy_s(lpBuffer, nBufferLength, CanonicalFullPath) != SAFECRT_SUCCESS)
            {
                ERROR("strcpy_s failed!\n");
                SetLastError( ERROR_FILENAME_EXCED_RANGE );
                nRet = 0;
                goto done;
            }

            if(NULL != lpFilePart)
            {
                *lpFilePart = strrchr(lpBuffer,'/');
                if(NULL == *lpFilePart)
                {
                    ASSERT("no '/' in full path!\n");
                }
                else
                {
                    /* point to character after last '/' */
                    (*lpFilePart)++;
                }
            }
        }
        else
        {
            /* if buffer is too small, report required length, including
               terminating null */
            nRet++;
        }
    }
done:
    LOGEXIT("SearchPathA returns DWORD %u\n", nRet);
    PERF_EXIT(SearchPathA);
    return nRet;
}